

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void rd_pick_ab_part(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
                    MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PC_TREE *pc_tree,
                    PICK_MODE_CONTEXT **dst_ctxs,PartitionSearchState *part_search_state,
                    RD_STATS *best_rdc,BLOCK_SIZE *ab_subsize,int (*ab_mi_pos) [2],
                    PARTITION_TYPE part_type,MB_MODE_INFO **mode_cache)

{
  _Bool _Var1;
  AV1_COMMON *cm_00;
  uint mi_col_00;
  int unaff_EBP;
  uint num_planes;
  long in_RDI;
  AV1_COMP *in_R8;
  ThreadData_conflict *in_R9;
  int64_t *unaff_R13;
  PICK_MODE_CONTEXT **unaff_R14;
  int unaff_R15D;
  BLOCK_SIZE unaff_retaddr;
  PARTITION_TYPE in_stack_00000008;
  BLOCK_SIZE *in_stack_00000010;
  int (*in_stack_00000018) [2];
  MB_MODE_INFO **in_stack_00000020;
  RD_SEARCH_MACROBLOCK_CONTEXT *in_stack_00000028;
  MACROBLOCK *in_stack_00000030;
  byte in_stack_00000038;
  _Bool find_best_ab_part;
  int64_t this_rdcost;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams blk_params;
  AV1_COMMON *cm;
  BLOCK_SIZE in_stack_ffffffffffffff0f;
  int in_stack_ffffffffffffff14;
  undefined1 local_94 [20];
  RD_STATS *in_stack_ffffffffffffff80;
  PC_TREE *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  memcpy(local_94,in_stack_00000018 + 1,0x2c);
  num_planes = in_stack_ffffffffffffff94 & 0xff;
  mi_col_00 = (uint)in_stack_00000038;
  _Var1 = rd_test_partition3(in_R8,in_R9,(TileDataEnc *)cm_00,
                             (TokenExtra **)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,unaff_R13,unaff_R14
                             ,unaff_R15D,unaff_EBP,unaff_retaddr,in_stack_00000008,in_stack_00000010
                             ,in_stack_00000018,in_stack_00000020);
  *(bool *)(in_stack_00000018[0x28] + 1) = (in_stack_00000018[0x28][1] & 1) != 0 || _Var1;
  av1_num_planes(cm_00);
  av1_restore_context(in_stack_00000030,in_stack_00000028,in_stack_ffffffffffffff14,mi_col_00,
                      in_stack_ffffffffffffff0f,num_planes);
  return;
}

Assistant:

static void rd_pick_ab_part(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PC_TREE *pc_tree, PICK_MODE_CONTEXT *dst_ctxs[SUB_PARTITIONS_AB],
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    const BLOCK_SIZE ab_subsize[SUB_PARTITIONS_AB],
    const int ab_mi_pos[SUB_PARTITIONS_AB][2], const PARTITION_TYPE part_type,
    const MB_MODE_INFO **mode_cache) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;
  int64_t this_rdcost = 0;

#if CONFIG_COLLECT_PARTITION_STATS
  PartitionTimingStats *part_timing_stats =
      &part_search_state->part_timing_stats;
  {
    RD_STATS tmp_sum_rdc;
    av1_init_rd_stats(&tmp_sum_rdc);
    tmp_sum_rdc.rate = part_search_state->partition_cost[part_type];
    tmp_sum_rdc.rdcost = RDCOST(x->rdmult, tmp_sum_rdc.rate, 0);
    if (best_rdc->rdcost - tmp_sum_rdc.rdcost >= 0) {
      start_partition_block_timer(part_timing_stats, part_type);
    }
  }
#endif

  // Test this partition and update the best partition.
  const bool find_best_ab_part = rd_test_partition3(
      cpi, td, tile_data, tp, pc_tree, best_rdc, &this_rdcost, dst_ctxs, mi_row,
      mi_col, bsize, part_type, ab_subsize, ab_mi_pos, mode_cache);
  part_search_state->found_best_partition |= find_best_ab_part;

#if CONFIG_COLLECT_PARTITION_STATS
  if (part_timing_stats->timer_is_on) {
    if (!find_best_ab_part) this_rdcost = INT64_MAX;
    end_partition_block_timer(part_timing_stats, part_type, this_rdcost);
  }
#endif
  av1_restore_context(x, x_ctx, mi_row, mi_col, bsize, av1_num_planes(cm));
}